

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

csptr __thiscall pstack::Reader::view(Reader *this,string *name,Off offset,Off size)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  csptr cVar2;
  Off local_68;
  Off offset_local;
  Off size_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  __shared_ptr<pstack::Reader_const,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_68 = size;
  std::__shared_ptr<pstack::Reader_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<pstack::Reader,void>
            (local_40,(__weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2> *)
                      &name->_M_string_length);
  std::
  make_shared<pstack::OffsetReader,std::__cxx11::string_const&,std::shared_ptr<pstack::Reader_const>,unsigned_long&,unsigned_long&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size_local,
             (shared_ptr<const_pstack::Reader> *)offset,(unsigned_long *)local_40,&local_68);
  _Var1._M_pi = a_Stack_50[0]._M_pi;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Reader = (_func_int **)size_local;
  (this->super_enable_shared_from_this<pstack::Reader>)._M_weak_this.
  super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var1._M_pi;
  size_local = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  cVar2.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar2.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (csptr)cVar2.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Reader::csptr
Reader::view(const std::string &name, Off offset, Off size) const {
   return std::make_shared<OffsetReader>(name, shared_from_this(), offset, size);
}